

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_copy.cpp
# Opt level: O2

void __thiscall
ON_SubDLevelComponentIdIterator::Initialize
          (ON_SubDLevelComponentIdIterator *this,bool bLevelLinkedListIncreasingId,Type ctype,
          ON_SubDimple *subdimple,ON_SubDLevel *level)

{
  ON_SubDComponentBaseLink *pOVar1;
  int iVar2;
  undefined7 in_register_00000011;
  long lStack_8;
  
  this->m_bLevelLinkedListIncreasingId = false;
  this->m_ctype = ctype;
  this->m_level_index = (unsigned_short)level->m_level_index;
  this->m_first = (ON_SubDComponentBaseLink *)0x0;
  this->m_current = (ON_SubDComponentBaseLink *)0x0;
  this->m_count = 0;
  this->m_prev_id = 0;
  iVar2 = (int)CONCAT71(in_register_00000011,ctype);
  if (iVar2 == 2) {
    lStack_8 = 8;
  }
  else if (iVar2 == 6) {
    lStack_8 = 0x28;
  }
  else {
    if (iVar2 != 4) {
      return;
    }
    lStack_8 = 0x18;
  }
  pOVar1 = *(ON_SubDComponentBaseLink **)((long)level->m_vertex + lStack_8 + -8);
  this->m_first = pOVar1;
  if ((pOVar1 != (ON_SubDComponentBaseLink *)0x0) &&
     (this->m_bLevelLinkedListIncreasingId = bLevelLinkedListIncreasingId,
     !bLevelLinkedListIncreasingId)) {
    ON_SubDimple::InitializeComponentIdIterator(subdimple,ctype,&this->m_cidit);
    return;
  }
  return;
}

Assistant:

void ON_SubDLevelComponentIdIterator::Initialize(
  bool bLevelLinkedListIncreasingId,
  ON_SubDComponentPtr::Type ctype,
  const ON_SubDimple& subdimple,
  const ON_SubDLevel& level
)
{
  m_bLevelLinkedListIncreasingId = false;
  m_ctype = ctype;
  m_level_index = (unsigned short)level.m_level_index;
  m_count = 0;
  m_prev_id = 0;
  m_first = nullptr;
  m_current = nullptr;

  switch (ctype)
  {
  case ON_SubDComponentPtr::Type::Vertex:
      m_first = (const ON_SubDComponentBaseLink*)level.m_vertex[0];
      break;
  case ON_SubDComponentPtr::Type::Edge:
      m_first = (const ON_SubDComponentBaseLink*)level.m_edge[0];
      break;
  case ON_SubDComponentPtr::Type::Face:
      m_first = (const ON_SubDComponentBaseLink*)level.m_face[0];
      break;
  default:
    m_first = nullptr;
    break;
  }

  if (nullptr == m_first)
    return;

  m_bLevelLinkedListIncreasingId = bLevelLinkedListIncreasingId;

  if (false == m_bLevelLinkedListIncreasingId)
  {
    subdimple.InitializeComponentIdIterator(ctype, m_cidit);
  }
}